

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

Event * ftxui::Event::Character(Event *__return_storage_ptr__,string *input)

{
  string *input_local;
  Event *event;
  
  Event(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->input_,(string *)input);
  __return_storage_ptr__->type_ = Character;
  return __return_storage_ptr__;
}

Assistant:

Event Event::Character(std::string input) {
  Event event;
  event.input_ = std::move(input);
  event.type_ = Type::Character;
  return event;
}